

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall
duckdb::TopNHeap::Scan(TopNHeap *this,TopNScanState *state,DataChunk *chunk,idx_t *pos)

{
  ulong uVar1;
  idx_t count_p;
  ulong uVar2;
  ulong uVar3;
  SelectionVector sel;
  SelectionVector local_30;
  
  uVar1 = *pos;
  local_30.sel_vector =
       (state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar2 = (long)(state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)local_30.sel_vector >> 2;
  uVar3 = uVar2 - uVar1;
  if (uVar1 <= uVar2 && uVar3 != 0) {
    local_30.sel_vector = local_30.sel_vector + uVar1;
    local_30.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_30.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *pos = uVar1 + 0x800;
    DataChunk::Reset(chunk);
    count_p = 0x800;
    if (uVar3 < 0x800) {
      count_p = uVar3;
    }
    DataChunk::Slice(chunk,&this->heap_data,&local_30,count_p,0);
    if (local_30.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void TopNHeap::Scan(TopNScanState &state, DataChunk &chunk, idx_t &pos) {
	if (pos >= state.scan_order.size()) {
		return;
	}
	SelectionVector sel(state.scan_order.data() + pos);
	idx_t count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.scan_order.size() - pos);
	pos += STANDARD_VECTOR_SIZE;

	chunk.Reset();
	chunk.Slice(heap_data, sel, count);
}